

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall FlowGraph::Destroy(FlowGraph *this)

{
  Func **ppFVar1;
  undefined1 *puVar2;
  IRKind IVar3;
  char cVar4;
  byte bVar5;
  OpCode OVar6;
  ushort uVar7;
  YieldOffsetResumeLabelList *pYVar8;
  Type pPVar9;
  List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *list;
  Loop *pLVar10;
  LabelInstr *pLVar11;
  Opnd *pOVar12;
  BasicBlock *pBVar13;
  Opnd *pOVar14;
  Type pSVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  code *pcVar19;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar20;
  bool bVar21;
  ExecutionMode EVar22;
  NodeBase *pNVar23;
  JITTimeFunctionBody *this_00;
  LabelInstr **ppLVar24;
  Type *ppBVar25;
  undefined4 *puVar26;
  Type *ppFVar27;
  Func **ppFVar28;
  Instr *pIVar29;
  BasicBlock *blNext;
  char *pcVar30;
  Func **ppFVar31;
  char *pcVar32;
  BasicBlock *pBVar33;
  uint uVar34;
  long lVar35;
  BranchInstr *branchInstr;
  long lVar36;
  Type pBVar37;
  LabelInstr *this_01;
  long lVar38;
  Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *this_02;
  undefined1 local_70 [8];
  Iterator __iter_1;
  BasicBlock *intermediateBlock;
  Iterator __iter;
  
  __iter.current._4_4_ = Func::HasTry(this->func);
  if (__iter.current._4_4_ != 0) {
    RemoveUnreachableBlocks(this);
  }
  pBVar33 = this->blockList;
  if (pBVar33 != (BasicBlock *)0x0) {
    pNVar23 = (NodeBase *)__tls_get_addr(&PTR_0155fe48);
    __iter_1.current = pNVar23;
    do {
      this_01 = (LabelInstr *)pBVar33->firstInstr;
      if ((*(ushort *)&pBVar33->field_0x18 & 3) == 1) {
        IVar3 = (this_01->super_Instr).m_kind;
        if (((IVar3 == InstrKindProfiledLabel) || (IVar3 == InstrKindLabel)) &&
           (this_01->m_block = (BasicBlock *)0x0, __iter.current._4_4_ == 0)) {
          this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          bVar21 = JITTimeFunctionBody::IsCoroutine(this_00);
          if ((bVar21) &&
             (pYVar8 = this->func->m_yieldOffsetResumeLabelList,
             0 < (pYVar8->
                 super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                 ).count)) {
            this_02 = (pYVar8->
                      super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                      ).buffer;
            ppLVar24 = JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>::Second
                                 (this_02);
            if (this_01 != *ppLVar24) {
              lVar36 = 0;
              lVar35 = 0;
              do {
                lVar38 = lVar35;
                lVar36 = lVar36 + 1;
                if ((pYVar8->
                    super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                    ).count <= lVar36) goto LAB_0041cf5a;
                pPVar9 = (pYVar8->
                         super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                         ).buffer;
                ppLVar24 = JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>::Second
                                     ((Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *)
                                      ((long)&pPVar9[1].first + lVar38));
                lVar35 = lVar38 + 0x18;
              } while (this_01 != *ppLVar24);
              this_02 = (Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *)
                        ((long)&pPVar9[1].first + lVar38);
            }
            this_01->field_0x78 = this_01->field_0x78 & 0xfb;
            list = this->func->m_yieldOffsetResumeLabelList;
            Js::
            CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
            ::Remove(&list->removePolicy,list,this_02);
          }
LAB_0041cf5a:
          if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
               (this_01->labelRefs).
               super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next != &this_01->labelRefs) ||
             (pNVar23 = __iter_1.current, (this_01->field_0x78 & 4) != 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pNVar23 = __iter_1.current;
            *(undefined4 *)&(__iter_1.current)->next = 1;
            bVar21 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x690,"(labelInstr->IsUnreferenced())",
                                "labelInstr->IsUnreferenced()");
            if (!bVar21) goto LAB_0041de61;
            *(undefined4 *)&pNVar23->next = 0;
          }
LAB_0041d3fc:
          IR::Instr::Remove(&this_01->super_Instr);
        }
      }
      else {
        if ((*(ushort *)&pBVar33->field_0x18 & 6) == 4) {
          IVar3 = (this_01->super_Instr).m_kind;
          if (((IVar3 != InstrKindProfiledLabel) && (IVar3 != InstrKindLabel)) ||
             ((this_01->field_0x78 & 1) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pNVar23->next = 1;
            bVar21 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x69e,
                                "(firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->m_isLoopTop)"
                                ,"Label not marked as loop top...");
            if (!bVar21) goto LAB_0041de61;
            *(undefined4 *)&pNVar23->next = 0;
          }
          intermediateBlock = (BasicBlock *)&pBVar33->loop->blockList;
          pBVar37 = (Type)0x0;
          pSVar20 = __iter_1.list;
          __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                        intermediateBlock;
LAB_0041d007:
          __iter_1.list = pSVar20;
          if (__iter.list == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pNVar23->next = 1;
            bVar21 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar21) goto LAB_0041de61;
            *(undefined4 *)&pNVar23->next = 0;
          }
          pBVar13 = (BasicBlock *)((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
          if (pBVar13 != intermediateBlock) {
            __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pBVar13;
            ppBVar25 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                 ((Iterator *)&intermediateBlock);
            pSVar20 = __iter_1.list;
            if (((*ppBVar25)->field_0x18 & 1) == 0) {
              local_70 = (undefined1  [8])&(*ppBVar25)->succList;
              __iter_1.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_70;
              do {
                if (__iter_1.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0
                   ) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *(undefined4 *)&pNVar23->next = 1;
                  bVar21 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
                  if (!bVar21) goto LAB_0041de61;
                  *(undefined4 *)&pNVar23->next = 0;
                }
                __iter_1.list =
                     (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                     ((__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
                pSVar20 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
                if ((undefined1  [8])__iter_1.list == local_70) goto LAB_0041d007;
                ppFVar27 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                     ((Iterator *)local_70);
                pBVar13 = (*ppFVar27)->succBlock;
                if (pBVar13 == (BasicBlock *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *(undefined4 *)&pNVar23->next = 1;
                  bVar21 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                      ,0x6a1,"(succ)","succ");
                  if (!bVar21) goto LAB_0041de61;
                  *(undefined4 *)&pNVar23->next = 0;
                }
              } while (pBVar13 != pBVar33);
              pBVar37 = *ppBVar25;
              pSVar20 = __iter_1.list;
            }
            goto LAB_0041d007;
          }
          if (pBVar37 == (Type)0x0) {
            IVar3 = (this_01->super_Instr).m_kind;
            if ((IVar3 != InstrKindLabel) && (IVar3 != InstrKindProfiledLabel)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&pNVar23->next = 1;
              bVar21 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                  ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar21) goto LAB_0041de61;
              *(undefined4 *)&pNVar23->next = 0;
            }
            this_01->field_0x78 = this_01->field_0x78 & 0xfe;
          }
          else {
            pBVar13 = pBVar37->next;
            ppFVar28 = &pBVar37->func;
            if (pBVar13 != (BasicBlock *)0x0) {
              ppFVar28 = (Func **)&pBVar13->firstInstr;
            }
            lVar35 = 0x18;
            if (pBVar13 == (BasicBlock *)0x0) {
              lVar35 = 0xd0;
            }
            if (*(char *)(*(long *)((long)&(*ppFVar28)->m_alloc + lVar35) + 0x39) != '\x02') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&pNVar23->next = 1;
              bVar21 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                  ,0x6ad,"(loopTail->GetLastInstr()->IsBranchInstr())",
                                  "LastInstr of loop should always be a branch no?");
              if (!bVar21) goto LAB_0041de61;
              *(undefined4 *)&pNVar23->next = 0;
            }
            pLVar10 = pBVar33->loop;
            pLVar11 = (LabelInstr *)pBVar33->firstInstr;
            IVar3 = (pLVar11->super_Instr).m_kind;
            if ((IVar3 != InstrKindLabel) && (IVar3 != InstrKindProfiledLabel)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&pNVar23->next = 1;
              bVar21 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                  ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar21) goto LAB_0041de61;
              *(undefined4 *)&pNVar23->next = 0;
            }
            pLVar10->loopTopLabel = pLVar11;
          }
        }
        if (__iter.current._4_4_ != 0) {
          UpdateRegionForBlock(this,pBVar33);
        }
        IVar3 = (this_01->super_Instr).m_kind;
        if ((IVar3 == InstrKindProfiledLabel) || (IVar3 == InstrKindLabel)) {
          this_01->m_block = (BasicBlock *)0x0;
          if ((__iter.current._4_4_ == 0) &&
             (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
               (this_01->labelRefs).
               super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next == &this_01->labelRefs &&
              ((this_01->field_0x78 & 4) == 0)))) {
            pBVar13 = pBVar33->next;
            ppFVar28 = (Func **)&pBVar13->firstInstr;
            if (pBVar13 == (BasicBlock *)0x0) {
              ppFVar28 = &pBVar33->func;
            }
            lVar35 = 0x18;
            if (pBVar13 == (BasicBlock *)0x0) {
              lVar35 = 0xd0;
            }
            if (this_01 == *(LabelInstr **)((long)&(*ppFVar28)->m_alloc + lVar35))
            goto LAB_0041d3fc;
            IR::Instr::Remove((Instr *)this_01);
          }
        }
        pBVar13 = pBVar33->next;
        ppFVar28 = (Func **)&pBVar13->firstInstr;
        if (pBVar13 == (BasicBlock *)0x0) {
          ppFVar28 = &pBVar33->func;
        }
        lVar35 = 0x18;
        if (pBVar13 == (BasicBlock *)0x0) {
          lVar35 = 0xd0;
        }
        this_01 = *(LabelInstr **)((long)&(*ppFVar28)->m_alloc + lVar35);
        if ((this_01->super_Instr).m_kind == InstrKindBranch) {
          OVar6 = (this_01->super_Instr).m_opcode;
          if (OVar6 < ADD) {
            bVar21 = OVar6 == MultiBr || OVar6 == Br;
          }
          else {
            bVar21 = LowererMD::IsUnconditionalBranch(&this_01->super_Instr);
          }
          if ((bVar21 != false) &&
             ((Instr *)(this_01->labelRefs).
                       super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.allocator
              == (this_01->super_Instr).m_next)) goto LAB_0041d3fc;
        }
      }
      pBVar33 = pBVar33->next;
    } while (pBVar33 != (BasicBlock *)0x0);
  }
  if (__iter.current._4_4_ != 0) {
    pBVar33 = this->blockList;
    if (pBVar33 != (BasicBlock *)0x0) {
      puVar26 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_0041d43a:
      if ((pBVar33->field_0x18 & 1) != 0) goto LAB_0041dde9;
      pIVar29 = pBVar33->firstInstr;
      IVar3 = pIVar29->m_kind;
      if ((IVar3 != InstrKindLabel) && (IVar3 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar26 = 1;
        bVar21 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                            ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar21) {
LAB_0041de61:
          pcVar19 = (code *)invalidInstructionException();
          (*pcVar19)();
        }
        *puVar26 = 0;
      }
      pOVar12 = pIVar29[1].m_src2;
      intermediateBlock = (BasicBlock *)&pBVar33->predList;
      __iter_1.current = (NodeBase *)pBVar33;
      __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)intermediateBlock;
LAB_0041d4c2:
      if (__iter.list == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar26 = 1;
        bVar21 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar21) goto LAB_0041de61;
        *puVar26 = 0;
      }
      pBVar33 = (BasicBlock *)__iter_1.current;
      __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((BasicBlock *)__iter.list == intermediateBlock) goto code_r0x0041d515;
      ppFVar27 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&intermediateBlock);
      pBVar33 = (*ppFVar27)->predBlock;
      if (pBVar33 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar26 = 1;
        bVar21 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x6e7,"(predBlock)","predBlock");
        if (!bVar21) goto LAB_0041de61;
        *puVar26 = 0;
      }
      pIVar29 = pBVar33->firstInstr;
      IVar3 = pIVar29->m_kind;
      if ((IVar3 != InstrKindLabel) && (IVar3 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar26 = 1;
        bVar21 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                            ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar21) goto LAB_0041de61;
        *puVar26 = 0;
      }
      pBVar13 = pBVar33->next;
      ppFVar28 = (Func **)&pBVar13->firstInstr;
      ppFVar1 = &pBVar33->func;
      ppFVar31 = ppFVar28;
      if (pBVar13 == (BasicBlock *)0x0) {
        ppFVar31 = ppFVar1;
      }
      lVar35 = 0x18;
      if (pBVar13 == (BasicBlock *)0x0) {
        lVar35 = 0xd0;
      }
      pOVar14 = pIVar29[1].m_src2;
      if (*(long *)((long)&(*ppFVar31)->m_alloc + lVar35) == 0) goto LAB_0041d6a3;
      ppFVar31 = ppFVar28;
      if (pBVar13 == (BasicBlock *)0x0) {
        ppFVar31 = ppFVar1;
      }
      lVar35 = 0x18;
      if (pBVar13 == (BasicBlock *)0x0) {
        lVar35 = 0xd0;
      }
      uVar7 = *(ushort *)(*(long *)((long)&(*ppFVar31)->m_alloc + lVar35) + 0x30);
      if (uVar7 < 0xeb) {
        if (uVar7 - 0xe7 < 2) {
          if (*(Opnd **)&pOVar12->m_valueType != pOVar14) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar26 = 1;
            bVar21 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x6f5,"(region->GetParent() == predRegion)",
                                "Bad region prop on entry to try-catch/finally");
            if (!bVar21) goto LAB_0041de61;
            *puVar26 = 0;
          }
          pBVar13 = pBVar33->next;
          ppFVar28 = (Func **)&pBVar13->firstInstr;
          if (pBVar13 == (BasicBlock *)0x0) {
            ppFVar28 = ppFVar1;
          }
          pSVar15 = __iter_1.current[0x38].next;
          lVar35 = 0x18;
          if (pBVar13 == (BasicBlock *)0x0) {
            lVar35 = 0xd0;
          }
          lVar35 = *(long *)((long)&(*ppFVar28)->m_alloc + lVar35);
          if (*(char *)(lVar35 + 0x39) != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar26 = 1;
            bVar21 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
            if (!bVar21) goto LAB_0041de61;
            *puVar26 = 0;
          }
          if (pSVar15 == *(Type *)(lVar35 + 0x68)) {
            pBVar33 = pBVar33->next;
            ppFVar28 = (Func **)&pBVar33->firstInstr;
            if (pBVar33 == (BasicBlock *)0x0) {
              ppFVar28 = ppFVar1;
            }
            lVar35 = 0x18;
            if (pBVar33 == (BasicBlock *)0x0) {
              lVar35 = 0xd0;
            }
            if (*(short *)(*(long *)((long)&(*ppFVar28)->m_alloc + lVar35) + 0x30) == 0xe7) {
              if (*(char *)&pOVar12->_vptr_Opnd == '\x03') goto LAB_0041d4c2;
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar26 = 1;
              uVar34 = 0x6fa;
              pcVar32 = "(region->GetType() == RegionTypeCatch)";
              pcVar30 = "Bad region type on entry to catch";
            }
            else {
              if (*(char *)&pOVar12->_vptr_Opnd == '\x04') goto LAB_0041d4c2;
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar26 = 1;
              uVar34 = 0x6fe;
              pcVar32 = "(region->GetType() == RegionTypeFinally)";
              pcVar30 = "Bad region type on entry to finally";
            }
          }
          else {
            if (*(char *)&pOVar12->_vptr_Opnd == '\x02') goto LAB_0041d4c2;
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar26 = 1;
            uVar34 = 0x703;
            pcVar32 = "(region->GetType() == RegionTypeTry)";
            pcVar30 = "Bad region type on entry to try";
          }
        }
        else {
          if (uVar7 != 9) {
            if (((uVar7 == 0xea) && (pOVar12 != *(Opnd **)&pOVar14->m_valueType)) &&
               ((pOVar12 != pOVar14 || (bVar21 = Func::IsLoopBodyInTry(this->func), !bVar21)))) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar26 = 1;
              uVar34 = 0x70d;
              pcVar32 = 
              "(region == predRegion->GetParent() || (region == predRegion && this->func->IsLoopBodyInTry()))"
              ;
              goto LAB_0041d97c;
            }
            goto LAB_0041d4c2;
          }
          if (pBVar13 == (BasicBlock *)0x0) {
            ppFVar28 = ppFVar1;
          }
          lVar35 = 0x18;
          if (pBVar13 == (BasicBlock *)0x0) {
            lVar35 = 0xd0;
          }
          lVar35 = *(long *)((long)&(*ppFVar28)->m_alloc + lVar35);
          if (*(char *)(lVar35 + 0x39) != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar26 = 1;
            bVar21 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
            if (!bVar21) goto LAB_0041de61;
            *puVar26 = 0;
          }
          if (*(char *)(lVar35 + 0x5b) != '\x01') {
            if (pOVar12 == pOVar14 || *(char *)&pOVar12->_vptr_Opnd != '\x03') {
              cVar4 = *(char *)&pOVar14->_vptr_Opnd;
              if (*(char *)&pOVar12->_vptr_Opnd != '\x04' || pOVar12 == pOVar14) {
                if (cVar4 == '\x04') {
                  bVar21 = (Opnd *)pOVar14[1]._vptr_Opnd[5] == pOVar14;
                }
                else {
                  bVar21 = false;
                }
                if ((pOVar12 != pOVar14) && (!bVar21)) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar26 = 1;
                  uVar34 = 0x732;
                  pcVar32 = "(predRegion->IsNonExceptingFinally() || region == predRegion)";
                  pcVar30 = "Bad region propagation through interior block";
                  goto LAB_0041dc25;
                }
                goto LAB_0041d4c2;
              }
              if ((cVar4 == '\x02') ||
                 ((cVar4 == '\x04' && ((Opnd *)pOVar14[1]._vptr_Opnd[5] == pOVar14))))
              goto LAB_0041d4c2;
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar26 = 1;
              uVar34 = 0x72d;
              pcVar32 = 
              "(predRegion->IsNonExceptingFinally() || predRegion->GetType() == RegionTypeTry)";
            }
            else {
              if (*(char *)&pOVar14->_vptr_Opnd == '\x02') goto LAB_0041d4c2;
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar26 = 1;
              uVar34 = 0x728;
              pcVar32 = "(predRegion->GetType() == RegionTypeTry)";
            }
            pcVar30 = "Bad region type for the try";
            goto LAB_0041dc25;
          }
          if (pOVar12 == *(Opnd **)&pOVar14->m_valueType) goto LAB_0041d4c2;
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar26 = 1;
          uVar34 = 0x724;
          pcVar32 = "(region == predRegion->GetParent())";
          pcVar30 = "Bad region prop in finally";
        }
      }
      else if (uVar7 == 0xeb) {
        if (((pOVar12 == *(Opnd **)&pOVar14->m_valueType) ||
            ((*(char *)&pOVar14->_vptr_Opnd == '\x02' &&
             (*(Opnd **)&pOVar14[2].m_valueType == pOVar12)))) ||
           ((pOVar12 == pOVar14 && (bVar21 = Func::IsLoopBodyInTry(this->func), bVar21))))
        goto LAB_0041d4c2;
        pBVar33 = pBVar33->next;
        ppFVar28 = (Func **)&pBVar33->firstInstr;
        if (pBVar33 == (BasicBlock *)0x0) {
          ppFVar28 = ppFVar1;
        }
        lVar35 = 0x18;
        if (pBVar33 == (BasicBlock *)0x0) {
          lVar35 = 0xd0;
        }
        pIVar29 = IR::Instr::GetPrevRealInstr(*(Instr **)((long)&(*ppFVar28)->m_alloc + lVar35));
        if (((pIVar29->m_opcode == BailOnEarlyExit) && (*(char *)&pOVar12->_vptr_Opnd == '\x04')) &&
           (EVar22 = JITTimeWorkItem::GetJitMode(this->func->m_workItem), EVar22 == SimpleJit))
        goto LAB_0041d4c2;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar26 = 1;
        uVar34 = 0x70a;
        pcVar32 = 
        "(region == predRegion->GetParent() || (predRegion->GetType() == RegionTypeTry && predRegion->GetMatchingFinallyRegion(false) == region) || (region == predRegion && this->func->IsLoopBodyInTry() || (predBlock->GetLastInstr()->GetPrevRealInstr()->m_opcode == Js::OpCode::BailOnEarlyExit && region->GetType() == RegionTypeFinally && this->func->IsSimpleJit())))"
        ;
LAB_0041d97c:
        pcVar30 = "Bad region prop on leaving try-catch/finally";
      }
      else if (uVar7 == 0x19e) {
        bVar21 = Func::DoGlobOpt(this->func);
        if (!bVar21) goto LAB_0041d4c2;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar26 = 1;
        uVar34 = 0x716;
        pcVar32 = "(!this->func->DoGlobOpt())";
        pcVar30 = "!this->func->DoGlobOpt()";
      }
      else {
        if ((uVar7 != 0x19f) || ((byte)(*(char *)&pOVar12->_vptr_Opnd - 2U) < 3)) goto LAB_0041d4c2;
        if (*(char *)&pOVar14->_vptr_Opnd == '\x04') {
          if (pBVar13 == (BasicBlock *)0x0) {
            ppFVar28 = ppFVar1;
          }
          lVar35 = 0x18;
          if (pBVar13 == (BasicBlock *)0x0) {
            lVar35 = 0xd0;
          }
          lVar35 = *(long *)((long)&(*ppFVar28)->m_alloc + lVar35);
          if (*(char *)(lVar35 + 0x39) != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar26 = 1;
            bVar21 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
            if (!bVar21) goto LAB_0041de61;
            *puVar26 = 0;
          }
          if ((*(byte *)(lVar35 + 0x58) & 0x10) != 0) goto LAB_0041d4c2;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar26 = 1;
        uVar34 = 0x71e;
        pcVar32 = 
        "(region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally || (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit))"
        ;
        pcVar30 = 
        "region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally || (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit)"
        ;
      }
      goto LAB_0041dc25;
    }
LAB_0041ddf5:
    pBVar33 = this->blockList;
    if (pBVar33 != (BasicBlock *)0x0 && __iter.current._4_4_ != 0) {
      do {
        pIVar29 = pBVar33->firstInstr;
        if ((((pIVar29->m_kind == InstrKindProfiledLabel) || (pIVar29->m_kind == InstrKindLabel)) &&
            ((Instr *)pIVar29[1]._vptr_Instr == pIVar29 + 1)) &&
           (((ulong)pIVar29[1].m_func & 4) == 0)) {
          IR::Instr::Remove(pIVar29);
        }
        pBVar33 = pBVar33->next;
      } while (pBVar33 != (BasicBlock *)0x0);
    }
  }
  puVar2 = &this->func->field_0x240;
  *(uint *)puVar2 = *(uint *)puVar2 & 0xfffbffff;
  return;
code_r0x0041d515:
  __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  bVar5 = *(byte *)&pOVar12->_vptr_Opnd;
  if (bVar5 - 3 < 2) {
    if (pOVar12[1]._vptr_Opnd != (_func_int **)0x0) goto LAB_0041dde9;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar26 = 1;
    uVar34 = 0x74f;
    pcVar32 = "(region->GetMatchingTryRegion())";
    pcVar30 = "region->GetMatchingTryRegion()";
  }
  else if (bVar5 == 2) {
    bVar21 = Func::DoOptimizeTry(this->func);
    if ((bVar21) ||
       ((EVar22 = JITTimeWorkItem::GetJitMode(this->func->m_workItem), EVar22 == SimpleJit &&
        ((this->func->field_0x240 & 0x10) != 0)))) {
      lVar35._0_2_ = pOVar12[1].m_valueType;
      lVar35._2_1_ = pOVar12[1].m_type;
      lVar35._3_1_ = pOVar12[1].field_0xb;
      lVar35._4_1_ = pOVar12[1].m_kind;
      lVar35._5_1_ = pOVar12[1].isDeleted;
      lVar35._6_2_ = *(undefined2 *)&pOVar12[1].field_0xe;
      if (pOVar12[2]._vptr_Opnd == (_func_int **)0x0) {
        bVar21 = false;
      }
      else {
        lVar36._0_2_ = pOVar12[2].m_valueType;
        lVar36._2_1_ = pOVar12[2].m_type;
        lVar36._3_1_ = pOVar12[2].field_0xb;
        lVar36._4_1_ = pOVar12[2].m_kind;
        lVar36._5_1_ = pOVar12[2].isDeleted;
        lVar36._6_2_ = *(undefined2 *)&pOVar12[2].field_0xe;
        bVar21 = lVar36 != 0;
      }
      if (bVar21 != (lVar35 != 0)) goto LAB_0041dde9;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar26 = 1;
      uVar34 = 0x745;
      pcVar32 = 
      "((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false)))"
      ;
      pcVar30 = 
      "(region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false))"
      ;
    }
    else {
      lVar38._0_2_ = pOVar12[1].m_valueType;
      lVar38._2_1_ = pOVar12[1].m_type;
      lVar38._3_1_ = pOVar12[1].field_0xb;
      lVar38._4_1_ = pOVar12[1].m_kind;
      lVar38._5_1_ = pOVar12[1].isDeleted;
      lVar38._6_2_ = *(undefined2 *)&pOVar12[1].field_0xe;
      if (pOVar12[2]._vptr_Opnd == (_func_int **)0x0) {
        bVar21 = false;
      }
      else {
        lVar18._0_2_ = pOVar12[2].m_valueType;
        lVar18._2_1_ = pOVar12[2].m_type;
        lVar18._3_1_ = pOVar12[2].field_0xb;
        lVar18._4_1_ = pOVar12[2].m_kind;
        lVar18._5_1_ = pOVar12[2].isDeleted;
        lVar18._6_2_ = *(undefined2 *)&pOVar12[2].field_0xe;
        bVar21 = lVar18 == 0;
      }
      if (bVar21 != (lVar38 != 0)) goto LAB_0041dde9;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar26 = 1;
      uVar34 = 0x749;
      pcVar32 = 
      "((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)))"
      ;
      pcVar30 = 
      "(region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false))"
      ;
    }
  }
  else {
    if ((bVar5 != 1) ||
       ((((pOVar12[1]._vptr_Opnd == (_func_int **)0x0 &&
          (lVar16._0_2_ = pOVar12[1].m_valueType, lVar16._2_1_ = pOVar12[1].m_type,
          lVar16._3_1_ = pOVar12[1].field_0xb, lVar16._4_1_ = pOVar12[1].m_kind,
          lVar16._5_1_ = pOVar12[1].isDeleted, lVar16._6_2_ = *(undefined2 *)&pOVar12[1].field_0xe,
          lVar16 == 0)) && (pOVar12[2]._vptr_Opnd == (_func_int **)0x0)) &&
        (lVar17._0_2_ = pOVar12[2].m_valueType, lVar17._2_1_ = pOVar12[2].m_type,
        lVar17._3_1_ = pOVar12[2].field_0xb, lVar17._4_1_ = pOVar12[2].m_kind,
        lVar17._5_1_ = pOVar12[2].isDeleted, lVar17._6_2_ = *(undefined2 *)&pOVar12[2].field_0xe,
        lVar17 == 0)))) goto LAB_0041dde9;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar26 = 1;
    uVar34 = 0x73f;
    pcVar32 = 
    "(!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false))"
    ;
    pcVar30 = 
    "!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)"
    ;
  }
  bVar21 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                      ,uVar34,pcVar32,pcVar30);
  if (!bVar21) goto LAB_0041de61;
  *puVar26 = 0;
LAB_0041dde9:
  pBVar33 = pBVar33->next;
  if (pBVar33 == (BasicBlock *)0x0) goto LAB_0041ddf5;
  goto LAB_0041d43a;
LAB_0041d6a3:
  if (pOVar12 == pOVar14) goto LAB_0041d4c2;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar26 = 1;
  uVar34 = 0x6ed;
  pcVar32 = "(region == predRegion)";
  pcVar30 = "Bad region propagation through empty block";
LAB_0041dc25:
  bVar21 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                      ,uVar34,pcVar32,pcVar30);
  if (!bVar21) goto LAB_0041de61;
  *puVar26 = 0;
  goto LAB_0041d4c2;
}

Assistant:

void
FlowGraph::Destroy(void)
{
    BOOL fHasTry = this->func->HasTry();
    if (fHasTry)
    {
        // Do unreachable code removal up front to avoid problems
        // with unreachable back edges, etc.
        this->RemoveUnreachableBlocks();
    }

    FOREACH_BLOCK_ALL(block, this)
    {
        IR::Instr * firstInstr = block->GetFirstInstr();
        if (block->isDeleted && !block->isDead)
        {
            if (firstInstr->IsLabelInstr())
            {
                IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
                labelInstr->UnlinkBasicBlock();
                // Removing the label for non try blocks as we have a deleted block which has the label instruction
                // still not removed; this prevents the assert for cases where the deleted blocks fall through to a helper block,
                // i.e. helper introduced by polymorphic inlining bailout.
                // Skipping Try blocks as we have dependency on blocks to get the last instr(see below in this function)
                if (!fHasTry)
                {
                    if (this->func->GetJITFunctionBody()->IsCoroutine())
                    {
                        // the label could be a yield resume label, in which case we also need to remove it from the YieldOffsetResumeLabels list
                        this->func->MapUntilYieldOffsetResumeLabels([this, &labelInstr](int i, const YieldOffsetResumeLabel& yorl)
                        {
                            if (labelInstr == yorl.Second())
                            {
                                labelInstr->m_hasNonBranchRef = false;
                                this->func->RemoveYieldOffsetResumeLabel(yorl);
                                return true;
                            }
                            return false;
                        });
                    }

                    Assert(labelInstr->IsUnreferenced());
                    labelInstr->Remove();
                }
            }
            continue;
        }

        if (block->isLoopHeader && !block->isDead)
        {
            // Mark the tail block of this loop (the last back-edge).  The register allocator
            // uses this to lexically find loops.
            BasicBlock *loopTail = nullptr;

            AssertMsg(firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->m_isLoopTop,
                "Label not marked as loop top...");
            FOREACH_BLOCK_IN_LOOP(loopBlock, block->loop)
            {
                FOREACH_SUCCESSOR_BLOCK(succ, loopBlock)
                {
                    if (succ == block)
                    {
                        loopTail = loopBlock;
                        break;
                    }
                } NEXT_SUCCESSOR_BLOCK;
            } NEXT_BLOCK_IN_LOOP;

            if (loopTail)
            {
                AssertMsg(loopTail->GetLastInstr()->IsBranchInstr(), "LastInstr of loop should always be a branch no?");
                block->loop->SetLoopTopInstr(block->GetFirstInstr()->AsLabelInstr());
            }
            else
            {
                // This loop doesn't have a back-edge: that is, it is not a loop
                // anymore...
                firstInstr->AsLabelInstr()->m_isLoopTop = FALSE;
            }
        }

        if (fHasTry)
        {
            this->UpdateRegionForBlock(block);
        }

        if (firstInstr->IsLabelInstr())
        {
            IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
            labelInstr->UnlinkBasicBlock();
            if (labelInstr->IsUnreferenced() && !fHasTry)
            {
                // This is an unreferenced label, probably added by FG building.
                // Delete it now to make extended basic blocks visible.
                if (firstInstr == block->GetLastInstr())
                {
                    labelInstr->Remove();
                    continue;
                }
                else
                {
                    labelInstr->Remove();
                }
            }
        }

        IR::Instr * lastInstr = block->GetLastInstr();
        if (lastInstr->IsBranchInstr())
        {
            IR::BranchInstr * branchInstr = lastInstr->AsBranchInstr();
            if (!branchInstr->IsConditional() && branchInstr->GetTarget() == branchInstr->m_next)
            {
                // Remove branch to next
                branchInstr->Remove();
            }
        }
    }
    NEXT_BLOCK;

#if DBG

    if (fHasTry)
    {
        // Now that all blocks have regions, we should see consistently propagated regions at all
        // block boundaries.
        FOREACH_BLOCK(block, this)
        {
            Region * region = block->GetFirstInstr()->AsLabelInstr()->GetRegion();
            FOREACH_PREDECESSOR_BLOCK(predBlock, block)
            {
                BasicBlock* intermediateBlock = block;
                Region * predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
                if (predBlock->GetLastInstr() == nullptr)
                {
                    AssertMsg(region == predRegion, "Bad region propagation through empty block");
                }
                else
                {
                    switch (predBlock->GetLastInstr()->m_opcode)
                    {
                    case Js::OpCode::TryCatch:
                    case Js::OpCode::TryFinally:
                        AssertMsg(region->GetParent() == predRegion, "Bad region prop on entry to try-catch/finally");
                        if (intermediateBlock->GetFirstInstr() == predBlock->GetLastInstr()->AsBranchInstr()->GetTarget())
                        {
                            if (predBlock->GetLastInstr()->m_opcode == Js::OpCode::TryCatch)
                            {
                                AssertMsg(region->GetType() == RegionTypeCatch, "Bad region type on entry to catch");
                            }
                            else
                            {
                                AssertMsg(region->GetType() == RegionTypeFinally, "Bad region type on entry to finally");
                            }
                        }
                        else
                        {
                            AssertMsg(region->GetType() == RegionTypeTry, "Bad region type on entry to try");
                        }
                        break;
                    case Js::OpCode::Leave:
                        AssertMsg(region == predRegion->GetParent() || (predRegion->GetType() == RegionTypeTry && predRegion->GetMatchingFinallyRegion(false) == region) ||
                            (region == predRegion && this->func->IsLoopBodyInTry() ||
                            // edge from early exit to finally in simplejit - in fulljit this Leave would have been deadcoded due to preceeding BailOutOnEarlyExit
                            (predBlock->GetLastInstr()->GetPrevRealInstr()->m_opcode == Js::OpCode::BailOnEarlyExit && region->GetType() == RegionTypeFinally && this->func->IsSimpleJit())), "Bad region prop on leaving try-catch/finally");
                        break;
                    case Js::OpCode::LeaveNull:
                        AssertMsg(region == predRegion->GetParent() || (region == predRegion && this->func->IsLoopBodyInTry()), "Bad region prop on leaving try-catch/finally");
                        break;

                    // If the try region has a branch out of the loop,
                    // - the branch is moved out of the loop as part of break block removal, and
                    // - BrOnException is inverted to BrOnNoException and a Br is inserted after it.
                    // Otherwise,
                    // - FullJit: BrOnException is removed in the forward pass.
                    case Js::OpCode::BrOnException:
                        Assert(!this->func->DoGlobOpt());
                        break;
                    case Js::OpCode::BrOnNoException:
                        Assert(region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally ||
                            // A BrOnException from finally to early exit can be converted to BrOnNoException and Br
                            // The Br block maybe a common successor block for early exit along with the BrOnNoException block
                            // Region from Br block will be picked up from a predecessor which is not BrOnNoException due to early exit
                            // See test0() in test/EH/tryfinallytests.js
                            (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit));
                        break;
                    case Js::OpCode::Br:
                        if (predBlock->GetLastInstr()->AsBranchInstr()->m_leaveConvToBr)
                        {
                            // Leave converted to Br in finally region
                            AssertMsg(region == predRegion->GetParent(), "Bad region prop in finally");
                        }
                        else if (region->GetType() == RegionTypeCatch && region != predRegion)
                        {
                            AssertMsg(predRegion->GetType() == RegionTypeTry, "Bad region type for the try");
                        }
                        else if (region->GetType() == RegionTypeFinally && region != predRegion)
                        {
                            // We may be left with edges from finally region to early exit
                            AssertMsg(predRegion->IsNonExceptingFinally() || predRegion->GetType() == RegionTypeTry, "Bad region type for the try");
                        }
                        else
                        {
                            // We may be left with edges from finally region to early exit
                            AssertMsg(predRegion->IsNonExceptingFinally() || region == predRegion, "Bad region propagation through interior block");
                        }
                        break;
                    default:
                        break;
                    }
                }
            }
            NEXT_PREDECESSOR_BLOCK;

            switch (region->GetType())
            {
            case RegionTypeRoot:
                Assert(!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false));
                break;

            case RegionTypeTry:
                if (this->func->DoOptimizeTry() || (this->func->IsSimpleJit() && this->func->hasBailout))
                {
                    Assert((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false)));
                }
                else
                {
                    Assert((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)));
                }
                break;

            case RegionTypeCatch:
            case RegionTypeFinally:
                Assert(region->GetMatchingTryRegion());
                break;
            }
        }
        NEXT_BLOCK;
    }
#endif
    if (fHasTry)
    {
        FOREACH_BLOCK_ALL(block, this)
        {
            if (block->GetFirstInstr()->IsLabelInstr())
            {
                IR::LabelInstr *labelInstr = block->GetFirstInstr()->AsLabelInstr();
                if (labelInstr->IsUnreferenced())
                {
                    // This is an unreferenced label, probably added by FG building.
                    // Delete it now to make extended basic blocks visible.
                    labelInstr->Remove();
                }
            }
        } NEXT_BLOCK;
    }
    this->func->isFlowGraphValid = false;
}